

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

Am_Object Am_Create_Screen(char *display_name)

{
  uint value;
  uint value_00;
  bool value_01;
  Am_Drawonable *pAVar1;
  Am_Wrapper *value_02;
  Am_Object *pAVar2;
  char *in_RSI;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object_Advanced temp;
  
  pAVar1 = Am_Drawonable::Get_Root_Drawonable(in_RSI);
  if (pAVar1 == (Am_Drawonable *)0x0) {
    display_name[0] = '\0';
    display_name[1] = '\0';
    display_name[2] = '\0';
    display_name[3] = '\0';
    display_name[4] = '\0';
    display_name[5] = '\0';
    display_name[6] = '\0';
    display_name[7] = '\0';
  }
  else {
    value = pAVar1->width;
    value_00 = pAVar1->height;
    Am_Object::Create(&local_48,(char *)&Am_Screen);
    value_02 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_Screen);
    pAVar2 = Am_Object::Set(&local_48,0x7d5,value_02,1);
    temp.super_Am_Object.data._0_2_ = Am_Am_Drawonable::Am_Am_Drawonable_ID;
    pAVar2 = Am_Object::Set(pAVar2,0x7d2,(Am_Value *)&temp,1);
    pAVar2 = Am_Object::Set(pAVar2,0x66,value,0);
    pAVar2 = Am_Object::Set(pAVar2,0x67,value_00,0);
    Am_Object::Am_Object((Am_Object *)display_name,pAVar2);
    Am_Value::~Am_Value((Am_Value *)&temp);
    Am_Object::~Am_Object(&local_48);
    Am_Object::Am_Object(&temp.super_Am_Object,(Am_Object *)display_name);
    Am_Object::Am_Object(&local_50,(Am_Object *)display_name);
    value_01 = screen_is_color(&local_50);
    Am_Object::Set((Am_Object *)display_name,0x87,value_01,0);
    Am_Object::~Am_Object(&local_50);
    Am_Object::~Am_Object(&temp.super_Am_Object);
  }
  return (Am_Object)(Am_Object_Data *)display_name;
}

Assistant:

Am_Object
Am_Create_Screen(const char *display_name)
{
  Am_Drawonable *new_root = Am_Drawonable::Get_Root_Drawonable(display_name);
  if (!new_root)
    return nullptr;
  int width, height;
  new_root->Get_Size(width, height);
  Am_Object new_screen =
      Am_Screen.Create(display_name)
          .Set(Am_SCREEN, Am_Screen, Am_OK_IF_NOT_THERE)
          .Set(Am_DRAWONABLE, (Am_Am_Drawonable)new_root, Am_OK_IF_NOT_THERE)
          .Set(Am_WIDTH, width)
          .Set(Am_HEIGHT, height);
  Am_Object_Advanced temp = (Am_Object_Advanced &)new_screen;
  //// NDY Create other slots that Am_Screen ought to have
  new_screen.Set(Am_IS_COLOR, screen_is_color(new_screen));
  return new_screen;
}